

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O3

void deqp::gles3::Functional::attachNamesTest(TestContext *testCtx,Context *context)

{
  deUint32 reservedRboName;
  deUint32 reservedTexName;
  uint local_20;
  uint local_1c;
  
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*context->_vptr_Context[7])(context,1,&local_1c);
  logComment((TestContext *)testCtx->m_log,"Attaching allocated texture name to 2D target");
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)local_1c,0);
  checkError(testCtx,context,0x502);
  logComment((TestContext *)testCtx->m_log,"Attaching allocated texture name to cube target");
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0x8516,(ulong)local_1c,0);
  checkError(testCtx,context,0x502);
  (*context->_vptr_Context[0xd])(context,1,&local_20);
  logComment((TestContext *)testCtx->m_log,"Attaching allocated renderbuffer name");
  (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)local_20);
  checkError(testCtx,context,0x502);
  return;
}

Assistant:

static void attachNamesTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// Just allocate some names, don't bind for storage
	deUint32 reservedTexName;
	context.genTextures(1, &reservedTexName);

	logComment(testCtx, "Attaching allocated texture name to 2D target");
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, reservedTexName, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	logComment(testCtx, "Attaching allocated texture name to cube target");
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, reservedTexName, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	deUint32 reservedRboName;
	context.genRenderbuffers(1, &reservedRboName);

	logComment(testCtx, "Attaching allocated renderbuffer name");
	context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, reservedRboName);
	checkError(testCtx, context, GL_INVALID_OPERATION);
}